

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

bool __thiscall DefaultNavigationKeys::Right(DefaultNavigationKeys *this,string *key)

{
  int iVar1;
  bool bVar2;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  (**(code **)((long)*this + 0x80))(&local_38,this);
  if (local_30 == key->_M_string_length) {
    if (local_30 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_38,(key->_M_dataplus)._M_p,local_30);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return bVar2;
}

Assistant:

virtual bool Right(const std::string& key) override { return Right() == key; }